

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clique.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_190540::CliqueRunner::post_nogood
          (CliqueRunner *this,vector<int,_std::allocator<int>_> *c)

{
  Nogood<int> nogood;
  _List_iterator<gss::innards::Nogood<int>_> local_18;
  
  nogood.literals.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  nogood.literals.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  nogood.literals.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  std::vector<int,std::allocator<int>>::
  _M_assign_aux<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
            ((vector<int,std::allocator<int>> *)&nogood,
             (c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start,(c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish);
  std::__cxx11::list<gss::innards::Nogood<int>,std::allocator<gss::innards::Nogood<int>>>::
  emplace_back<gss::innards::Nogood<int>>
            ((list<gss::innards::Nogood<int>,std::allocator<gss::innards::Nogood<int>>> *)
             &this->watches,&nogood);
  local_18 = std::prev<std::_List_iterator<gss::innards::Nogood<int>>>
                       ((_List_iterator<gss::innards::Nogood<int>_>)&this->watches,1);
  std::__cxx11::
  list<std::_List_iterator<gss::innards::Nogood<int>>,std::allocator<std::_List_iterator<gss::innards::Nogood<int>>>>
  ::emplace_back<std::_List_iterator<gss::innards::Nogood<int>>>
            ((list<std::_List_iterator<gss::innards::Nogood<int>>,std::allocator<std::_List_iterator<gss::innards::Nogood<int>>>>
              *)&(this->watches).need_to_watch,&local_18);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&nogood);
  return;
}

Assistant:

auto post_nogood(
            const vector<int> & c)
        {
            Nogood<int> nogood;
            nogood.literals.assign(c.begin(), c.end());
            watches.post_nogood(move(nogood));
        }